

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O0

void __thiscall
vkt::anon_unknown_0::PixelValue::PixelValue
          (PixelValue *this,Maybe<bool> *x,Maybe<bool> *y,Maybe<bool> *z,Maybe<bool> *w)

{
  bool bVar1;
  bool *pbVar2;
  Maybe<bool> *local_e0;
  ulong local_98;
  size_t ndx;
  undefined1 local_78 [8];
  Maybe<bool> values [4];
  Maybe<bool> *w_local;
  Maybe<bool> *z_local;
  Maybe<bool> *y_local;
  Maybe<bool> *x_local;
  PixelValue *this_local;
  
  this->m_status = 0;
  tcu::Maybe<bool>::Maybe((Maybe<bool> *)local_78,x);
  tcu::Maybe<bool>::Maybe((Maybe<bool> *)&values[0].field_1,y);
  tcu::Maybe<bool>::Maybe((Maybe<bool> *)&values[1].field_1,z);
  tcu::Maybe<bool>::Maybe((Maybe<bool> *)&values[2].field_1,w);
  for (local_98 = 0; local_98 < 4; local_98 = local_98 + 1) {
    bVar1 = tcu::Maybe::operator_cast_to_bool((Maybe *)values[local_98 - 1].field_1.m_data);
    if (bVar1) {
      pbVar2 = tcu::Maybe<bool>::operator*((Maybe<bool> *)&values[local_98 - 1].field_1);
      setValue(this,local_98,(bool)(*pbVar2 & 1));
    }
    else {
      setUndefined(this,local_98);
    }
  }
  local_e0 = (Maybe<bool> *)&values[3].field_1;
  do {
    local_e0 = local_e0 + -1;
    tcu::Maybe<bool>::~Maybe(local_e0);
  } while (local_e0 != (Maybe<bool> *)local_78);
  return;
}

Assistant:

PixelValue::PixelValue (const Maybe<bool>&	x,
						const Maybe<bool>&	y,
						const Maybe<bool>&	z,
						const Maybe<bool>&	w)
	: m_status (0)
{
	const Maybe<bool> values[] =
	{
		x, y, z, w
	};

	for (size_t ndx = 0; ndx < DE_LENGTH_OF_ARRAY(values); ndx++)
	{
		if (values[ndx])
			setValue(ndx, *values[ndx]);
		else
			setUndefined(ndx);
	}

	DE_ASSERT(m_status <= 0xFFu);
}